

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall hdc::Driver::setFlags(Driver *this,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  allocator local_71;
  Logger *local_70;
  string *local_68;
  string *local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (1 < argc) {
    local_60 = (string *)&this->mainFilePath;
    local_68 = &this->outputName;
    local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->searchPath;
    local_70 = &this->logger;
    iVar5 = 1;
    do {
      pcVar1 = argv[iVar5];
      iVar2 = strcmp(pcVar1,"-cpp");
      if (iVar2 == 0) {
        this->emitCppFlag = true;
      }
      else {
        iVar2 = strcmp(pcVar1,"-log");
        if (iVar2 == 0) {
          iVar4 = iVar5 + 1;
          iVar2 = strcmp(argv[(long)iVar5 + 1],"all");
          iVar5 = iVar4;
          if (iVar2 == 0) {
            Logger::setAllFlags(local_70);
          }
        }
        else {
          iVar2 = strcmp(pcVar1,"-i");
          if (iVar2 == 0) {
            std::__cxx11::string::string((string *)&local_50,argv[(long)iVar5 + 1],&local_71);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_58,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            iVar5 = iVar5 + 1;
          }
          else {
            iVar2 = strcmp(pcVar1,"-o");
            if (iVar2 == 0) {
              pcVar1 = argv[(long)iVar5 + 1];
              pcVar3 = (char *)(this->outputName)._M_string_length;
              strlen(pcVar1);
              std::__cxx11::string::_M_replace((ulong)local_68,0,pcVar3,(ulong)pcVar1);
              iVar5 = iVar5 + 1;
            }
            else {
              pcVar3 = strstr(pcVar1,".hd");
              if (pcVar3 != (char *)0x0) {
                std::__cxx11::string::string((string *)&local_50,pcVar1,&local_71);
                std::__cxx11::string::operator=(local_60,(string *)&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
              }
            }
          }
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  return;
}

Assistant:

void Driver::setFlags(int argc, char* argv[]) {
    for (int i = 1; i < argc; ++i) {
        if (strcmp(argv[i], "-cpp") == 0) {
            emitCppFlag = true;
        } else if (strcmp(argv[i], "-log") == 0) {
            ++i;

            if (strcmp(argv[i], "all") == 0) {
                logger.setAllFlags();
            }
        } else if (strcmp(argv[i], "-i") == 0) {
            ++i;

            searchPath.push_back(argv[i]);
        } else if (strcmp(argv[i], "-o") == 0) {
            ++i;

            outputName = argv[i];
        } else if (strstr(argv[i], ".hd") != nullptr) {
            mainFilePath = std::string(argv[i]);
        }
    }
}